

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fixDistinctOpenEph(Parse *pParse,int eTnctType,int iVal,int iOpenEphAddr)

{
  Vdbe *p;
  Op *pOVar1;
  
  if (pParse->nErr != 0) {
    return;
  }
  if (eTnctType - 1U < 2) {
    p = pParse->pVdbe;
    sqlite3VdbeChangeToNoop(p,iOpenEphAddr);
    if (p->db->mallocFailed == '\0') {
      pOVar1 = p->aOp + (iOpenEphAddr + 1);
    }
    else {
      pOVar1 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    if (pOVar1->opcode == 0xb9) {
      sqlite3VdbeChangeToNoop(p,iOpenEphAddr + 1);
    }
    if (eTnctType == 2) {
      if (p->db->mallocFailed == '\0') {
        pOVar1 = p->aOp + iOpenEphAddr;
      }
      else {
        pOVar1 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar1->opcode = 'K';
      pOVar1->p1 = 1;
      pOVar1->p2 = iVal;
    }
  }
  return;
}

Assistant:

static void fixDistinctOpenEph(
  Parse *pParse,     /* Parsing and code generating context */
  int eTnctType,     /* WHERE_DISTINCT_* value */
  int iVal,          /* Value returned by codeDistinct() */
  int iOpenEphAddr   /* Address of OP_OpenEphemeral instruction for iTab */
){
  if( pParse->nErr==0
   && (eTnctType==WHERE_DISTINCT_UNIQUE || eTnctType==WHERE_DISTINCT_ORDERED)
  ){
    Vdbe *v = pParse->pVdbe;
    sqlite3VdbeChangeToNoop(v, iOpenEphAddr);
    if( sqlite3VdbeGetOp(v, iOpenEphAddr+1)->opcode==OP_Explain ){
      sqlite3VdbeChangeToNoop(v, iOpenEphAddr+1);
    }
    if( eTnctType==WHERE_DISTINCT_ORDERED ){
      /* Change the OP_OpenEphemeral to an OP_Null that sets the MEM_Cleared
      ** bit on the first register of the previous value.  This will cause the
      ** OP_Ne added in codeDistinct() to always fail on the first iteration of
      ** the loop even if the first row is all NULLs.  */
      VdbeOp *pOp = sqlite3VdbeGetOp(v, iOpenEphAddr);
      pOp->opcode = OP_Null;
      pOp->p1 = 1;
      pOp->p2 = iVal;
    }
  }
}